

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O0

void api_fixed_suite::fixed_first_unused_segment_const(void)

{
  size_type *this;
  pointer *this_00;
  pointer *this_01;
  initializer_list<int> __l;
  iterator begin;
  iterator end;
  iterator first;
  pointer first_begin;
  pointer ptVar1;
  size_type sVar2;
  iterator second_begin;
  iterator second_end;
  allocator<int> local_71;
  int local_70 [2];
  iterator local_68;
  size_type local_60;
  undefined1 local_58 [8];
  vector<int,_std::allocator<int>_> expect;
  const_segment segment;
  circular_view<int,_4UL> span;
  array<int,_4UL> array;
  
  span.member.next = 0x160000000b;
  this = &span.member.next;
  begin = std::array<int,_4UL>::begin((array<int,_4UL> *)this);
  end = std::array<int,_4UL>::end((array<int,_4UL> *)this);
  first = std::array<int,_4UL>::begin((array<int,_4UL> *)this);
  this_00 = &segment.member.tail;
  vista::circular_view<int,4ul>::circular_view<int*>
            ((circular_view<int,4ul> *)this_00,begin,end,first,2);
  join_0x00000010_0x00000000_ =
       (member_storage<const_int,_18446744073709551615UL>)
       vista::circular_view<int,_4UL>::first_unused_segment((circular_view<int,_4UL> *)this_00);
  local_70[0] = 0;
  local_70[1] = 0;
  local_68 = local_70;
  local_60 = 2;
  std::allocator<int>::allocator(&local_71);
  __l._M_len = local_60;
  __l._M_array = local_68;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_58,__l,&local_71);
  std::allocator<int>::~allocator(&local_71);
  this_01 = &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  first_begin = vista::span<const_int,_18446744073709551615UL>::data
                          ((span<const_int,_18446744073709551615UL> *)this_01);
  ptVar1 = vista::span<const_int,_18446744073709551615UL>::data
                     ((span<const_int,_18446744073709551615UL> *)this_01);
  sVar2 = vista::span<const_int,_18446744073709551615UL>::size
                    ((span<const_int,_18446744073709551615UL> *)this_01);
  second_begin = std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)local_58);
  second_end = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_58);
  boost::detail::
  test_all_eq_impl<std::ostream,int_const*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x4c7,"void api_fixed_suite::fixed_first_unused_segment_const()",first_begin,
             ptVar1 + sVar2,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_begin._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_end._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_58);
  return;
}

Assistant:

void fixed_first_unused_segment_const()
{
    std::array<int, 4> array = { 11, 22 };
    const circular_view<int, 4> span(array.begin(), array.end(), array.begin(), 2);
    auto segment = span.first_unused_segment();
    {
        std::vector<int> expect = { 0, 0 };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
}